

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O0

void IFLT(ffe_t *data,uint size,uint index)

{
  ffe_t fVar1;
  ffe_t fVar2;
  ushort *puVar3;
  int in_EDX;
  ushort *puVar4;
  uint in_ESI;
  long in_RDI;
  uint i;
  ffe_t skew;
  uint j;
  uint width;
  uint local_38;
  uint local_30;
  uint local_2c;
  
  for (local_2c = 1; local_2c < in_ESI; local_2c = local_2c << 1) {
    for (local_30 = local_2c; local_30 < in_ESI; local_30 = local_2c * 2 + local_30) {
      fVar1 = skewVec[(local_30 + in_EDX) - 1];
      for (local_38 = local_30 - local_2c; local_38 < local_30; local_38 = local_38 + 1) {
        puVar4 = (ushort *)(in_RDI + (ulong)local_38 * 2);
        puVar3 = (ushort *)(in_RDI + (ulong)(local_38 + local_2c) * 2);
        *puVar3 = *puVar3 ^ *puVar4;
        if (fVar1 != 0xffff) {
          fVar2 = mulE(0,0x10);
          *puVar4 = *puVar4 ^ fVar2;
        }
      }
    }
  }
  return;
}

Assistant:

static void IFLT(ffe_t* data, const unsigned size, const unsigned index)
{
    for (unsigned width = 1; width < size; width <<= 1)
    {
        for (unsigned j = width; j < size; j += (width << 1))
        {
            const ffe_t skew = skewVec[j + index - 1];

            for (unsigned i = j - width; i < j; ++i)
                ifft_butterfly(data[i], data[i + width], skew);
        }
    }
}